

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3BtreeInsert(BtCursor *pCur,BtreePayload *pX,int flags,int seekResult)

{
  byte bVar1;
  ushort uVar2;
  Btree *pBtree;
  BtShared *pBVar3;
  MemPage *pMVar4;
  Pgno parent;
  BtreePayload *pBVar5;
  BtCursor *pCur_00;
  int iVar6;
  Pgno PVar7;
  void *pvVar8;
  Pgno PVar9;
  ulong uVar10;
  uint *puVar11;
  void *pvVar12;
  u64 v;
  void *pvVar13;
  int iVar14;
  u8 *__s;
  ulong uVar15;
  uint uVar16;
  size_t __n;
  int local_ac;
  uint local_a8;
  int loc;
  Pgno local_a0;
  int local_9c;
  uint *local_98;
  BtreePayload *local_90;
  void *local_88;
  int rc;
  ulong local_78;
  uint *local_70;
  MemPage *local_68;
  MemPage *local_60;
  BtShared *local_58;
  MemPage *pOvfl;
  sqlite3_value *local_48;
  u16 local_40;
  undefined2 uStack_3e;
  ushort uStack_3c;
  ushort local_3a;
  BtCursor *local_38;
  
  if (pCur->eState == '\x04') {
    iVar6 = pCur->skipNext;
  }
  else {
    pBtree = pCur->pBtree;
    pBVar3 = pBtree->pBt;
    loc = seekResult;
    local_90 = pX;
    if (((pCur->curFlags & 0x20) == 0) ||
       (iVar6 = saveAllCursors(pBVar3,pCur->pgnoRoot,pCur), local_ac = iVar6, iVar6 == 0)) {
      pBVar5 = local_90;
      pOvfl = (MemPage *)pCur->pKeyInfo;
      local_9c = flags;
      local_58 = pBVar3;
      if (pOvfl == (MemPage *)0x0) {
        invalidateIncrblobCursors(pBtree,pCur->pgnoRoot,local_90->nKey,0);
        if (((pCur->curFlags & 2) == 0) || (pBVar5->nKey != (pCur->info).nKey)) {
          if (seekResult == 0) {
            iVar6 = sqlite3BtreeMovetoUnpacked
                              (pCur,(UnpackedRecord *)0x0,pBVar5->nKey,(uint)(local_9c != 0),&loc);
            if (iVar6 != 0) {
              return iVar6;
            }
            local_ac = 0;
          }
        }
        else {
          loc = 0;
        }
      }
      else if ((flags & 2U) == 0 && seekResult == 0) {
        if (local_90->nMem == 0) {
          local_ac = btreeMoveto(pCur,local_90->pKey,local_90->nKey,(uint)(flags != 0),&loc);
        }
        else {
          local_48 = local_90->aMem;
          uStack_3e._0_1_ = '\0';
          uStack_3e._1_1_ = '\0';
          uStack_3c = 0;
          local_3a = local_3a & 0xff00;
          local_40 = local_90->nMem;
          local_ac = sqlite3BtreeMovetoUnpacked
                               (pCur,(UnpackedRecord *)&pOvfl,0,(uint)(flags != 0),&loc);
        }
        if (local_ac != 0) {
          return local_ac;
        }
      }
      pMVar4 = pCur->apPage[pCur->iPage];
      puVar11 = (uint *)local_58->pTmpSpace;
      pOvfl = (MemPage *)0x0;
      pBVar3 = pMVar4->pBt;
      local_a0 = 0;
      bVar1 = pMVar4->childPtrSize;
      uVar10 = (ulong)bVar1;
      local_98 = puVar11;
      local_38 = pCur;
      if (pMVar4->intKey == '\0') {
        pvVar8 = local_90->pKey;
        uVar15 = local_90->nKey;
        if ((uint)uVar15 < 0x80) {
          *(u8 *)((long)puVar11 + uVar10) = (u8)uVar15;
          uVar16 = 1;
        }
        else {
          uVar16 = sqlite3PutVarint((uchar *)((long)puVar11 + uVar10),(long)(int)(uint)uVar15);
          uVar16 = uVar16 & 0xff;
        }
        iVar6 = uVar16 + bVar1;
        v = uVar15 & 0xffffffff;
        puVar11 = local_98;
      }
      else {
        local_78 = (ulong)local_90->nData;
        v = (long)local_90->nZero + local_78;
        local_88 = local_90->pData;
        if ((uint)v < 0x80) {
          uVar16 = 1;
          *(u8 *)((long)puVar11 + uVar10) = (u8)v;
        }
        else {
          uVar16 = sqlite3PutVarint((uchar *)(uVar10 + (long)puVar11),v);
          uVar16 = uVar16 & 0xff;
        }
        uVar16 = uVar16 + bVar1;
        iVar6 = sqlite3PutVarint((uchar *)((ulong)uVar16 + (long)puVar11),local_90->nKey);
        iVar6 = iVar6 + uVar16;
        pvVar8 = local_88;
        uVar15 = local_78;
      }
      iVar14 = (int)v;
      if ((int)(uint)pMVar4->maxLocal < iVar14) {
        uVar2 = pMVar4->minLocal;
        uVar16 = (iVar14 - (uint)uVar2) % (pMVar4->pBt->usableSize - 4) + (uint)uVar2;
        if ((int)(uint)pMVar4->maxLocal < (int)uVar16) {
          uVar16 = (uint)uVar2;
        }
        pvVar13 = (void *)(ulong)uVar16;
        local_a8 = uVar16 + iVar6 + 4;
        local_70 = (uint *)((long)(int)(uVar16 + iVar6) + (long)puVar11);
      }
      else {
        local_a8 = iVar14 + iVar6;
        if ((int)local_a8 < 5) {
          local_a8 = 4;
        }
        pvVar13 = (void *)(v & 0xffffffff);
        local_70 = puVar11;
      }
      __s = (u8 *)((long)iVar6 + (long)puVar11);
      local_68 = (MemPage *)0x0;
      local_60 = pMVar4;
      while (parent = local_a0, iVar6 = sqlite3PendingByte, 0 < (int)v) {
        local_78 = v;
        if ((int)pvVar13 == 0) {
          PVar9 = local_a0;
          local_88 = pvVar8;
          if (pBVar3->autoVacuum != '\0') {
            do {
              do {
                uVar16 = PVar9;
                PVar9 = uVar16 + 1;
                PVar7 = ptrmapPageno(pBVar3,PVar9);
              } while (PVar9 == PVar7);
            } while (uVar16 == (uint)iVar6 / pBVar3->pageSize);
            local_a0 = uVar16 + 1;
          }
          iVar6 = allocateBtreePage(pBVar3,&pOvfl,&local_a0,local_a0,'\0');
          PVar9 = local_a0;
          rc = iVar6;
          if ((pBVar3->autoVacuum == '\0') || (iVar6 != 0)) {
            if (iVar6 != 0) goto LAB_00137fb1;
          }
          else {
            ptrmapPut(pBVar3,local_a0,'\x04' - (parent == 0),parent,&rc);
            iVar6 = rc;
            if (rc != 0) {
              releasePage(pOvfl);
              goto LAB_00137fb1;
            }
          }
          *local_70 = PVar9 >> 0x18 | (PVar9 & 0xff0000) >> 8 | (PVar9 & 0xff00) << 8 |
                      PVar9 << 0x18;
          releasePage(local_68);
          local_70 = (uint *)pOvfl->aData;
          *local_70 = 0;
          local_68 = pOvfl;
          __s = pOvfl->aData + 4;
          pvVar13 = (void *)(ulong)(pBVar3->usableSize - 4);
          pvVar8 = local_88;
        }
        pvVar12 = pvVar13;
        if ((int)local_78 < (int)pvVar13) {
          pvVar12 = (void *)(local_78 & 0xffffffff);
        }
        iVar14 = (int)uVar15;
        iVar6 = (int)pvVar12;
        local_88 = pvVar13;
        if (iVar14 < 1) {
          __n = (size_t)iVar6;
          memset(__s,0,__n);
        }
        else {
          if (iVar14 <= iVar6) {
            iVar6 = iVar14;
          }
          __n = (size_t)iVar6;
          memcpy(__s,pvVar8,__n);
        }
        __s = __s + __n;
        pvVar8 = (void *)((long)pvVar8 + __n);
        uVar15 = (ulong)(uint)(iVar14 - iVar6);
        pvVar13 = (void *)(ulong)(uint)((int)local_88 - iVar6);
        v = (u64)(uint)((int)local_78 - iVar6);
      }
      iVar6 = 0;
LAB_00137fb1:
      releasePage(local_68);
      pCur_00 = local_38;
      pMVar4 = local_60;
      if (iVar6 == 0) {
        uVar2 = local_38->ix;
        uVar16 = (uint)uVar2;
        local_ac = iVar6;
        if (loc == 0) {
          iVar6 = sqlite3PagerWrite(local_60->pDbPage);
          if (iVar6 != 0) {
            return iVar6;
          }
          puVar11 = (uint *)(pMVar4->aData +
                            (CONCAT11(pMVar4->aCellIdx[(ulong)uVar2 * 2],
                                      pMVar4->aCellIdx[(ulong)uVar2 * 2 + 1]) & pMVar4->maskPage));
          if (pMVar4->leaf == '\0') {
            *local_98 = *puVar11;
          }
          local_ac = clearCell(pMVar4,(uchar *)puVar11,(CellInfo *)&pOvfl);
          if (((local_a8 == local_3a) && (CONCAT22(uStack_3e,local_40) == (uint)uStack_3c)) &&
             ((local_58->autoVacuum == '\0' || (local_a8 < pMVar4->minLocal)))) {
            if (pMVar4->aDataEnd < (u8 *)((long)puVar11 + (ulong)local_a8)) {
              iVar6 = sqlite3CorruptError(0x108ba);
              return iVar6;
            }
            memcpy(puVar11,local_98,(ulong)local_a8);
            return 0;
          }
          dropCell(pMVar4,(uint)uVar2,(uint)local_3a,&local_ac);
          if (local_ac != 0) {
            return local_ac;
          }
        }
        else if ((loc < 0) && (local_60->nCell != 0)) {
          local_38->ix = uVar2 + 1;
          uVar16 = (uint)(ushort)(uVar2 + 1);
          local_38->curFlags = local_38->curFlags & 0xfd;
        }
        pBVar5 = local_90;
        insertCell(pMVar4,uVar16,(u8 *)local_98,local_a8,(u8 *)0x0,0,&local_ac);
        (pCur_00->info).nSize = 0;
        iVar6 = local_ac;
        if (pMVar4->nOverflow != '\0') {
          pCur_00->curFlags = pCur_00->curFlags & 0xfd;
          iVar6 = balance(pCur_00);
          pCur_00->apPage[pCur_00->iPage]->nOverflow = '\0';
          pCur_00->eState = '\0';
          if ((iVar6 == 0 & (byte)local_9c >> 1) == 1) {
            iVar6 = moveToRoot(pCur_00);
            if (pCur_00->pKeyInfo != (KeyInfo *)0x0) {
              pvVar8 = sqlite3Malloc(pBVar5->nKey);
              pCur_00->pKey = pvVar8;
              if (pvVar8 == (void *)0x0) {
                iVar6 = 7;
              }
              else {
                memcpy(pvVar8,pBVar5->pKey,pBVar5->nKey);
              }
            }
            pCur_00->eState = '\x03';
            pCur_00->nKey = pBVar5->nKey;
          }
        }
      }
    }
  }
  return iVar6;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeInsert(
  BtCursor *pCur,                /* Insert data into the table of this cursor */
  const BtreePayload *pX,        /* Content of the row to be inserted */
  int flags,                     /* True if this is likely an append */
  int seekResult                 /* Result of prior MovetoUnpacked() call */
){
  int rc;
  int loc = seekResult;          /* -1: before desired location  +1: after */
  int szNew = 0;
  int idx;
  MemPage *pPage;
  Btree *p = pCur->pBtree;
  BtShared *pBt = p->pBt;
  unsigned char *oldCell;
  unsigned char *newCell = 0;

  assert( (flags & (BTREE_SAVEPOSITION|BTREE_APPEND))==flags );

  if( pCur->eState==CURSOR_FAULT ){
    assert( pCur->skipNext!=SQLITE_OK );
    return pCur->skipNext;
  }

  assert( cursorOwnsBtShared(pCur) );
  assert( (pCur->curFlags & BTCF_WriteFlag)!=0
              && pBt->inTransaction==TRANS_WRITE
              && (pBt->btsFlags & BTS_READ_ONLY)==0 );
  assert( hasSharedCacheTableLock(p, pCur->pgnoRoot, pCur->pKeyInfo!=0, 2) );

  /* Assert that the caller has been consistent. If this cursor was opened
  ** expecting an index b-tree, then the caller should be inserting blob
  ** keys with no associated data. If the cursor was opened expecting an
  ** intkey table, the caller should be inserting integer keys with a
  ** blob of associated data.  */
  assert( (pX->pKey==0)==(pCur->pKeyInfo==0) );

  /* Save the positions of any other cursors open on this table.
  **
  ** In some cases, the call to btreeMoveto() below is a no-op. For
  ** example, when inserting data into a table with auto-generated integer
  ** keys, the VDBE layer invokes sqlite3BtreeLast() to figure out the 
  ** integer key to use. It then calls this function to actually insert the 
  ** data into the intkey B-Tree. In this case btreeMoveto() recognizes
  ** that the cursor is already where it needs to be and returns without
  ** doing any work. To avoid thwarting these optimizations, it is important
  ** not to clear the cursor here.
  */
  if( pCur->curFlags & BTCF_Multiple ){
    rc = saveAllCursors(pBt, pCur->pgnoRoot, pCur);
    if( rc ) return rc;
  }

  if( pCur->pKeyInfo==0 ){
    assert( pX->pKey==0 );
    /* If this is an insert into a table b-tree, invalidate any incrblob 
    ** cursors open on the row being replaced */
    invalidateIncrblobCursors(p, pCur->pgnoRoot, pX->nKey, 0);

    /* If BTREE_SAVEPOSITION is set, the cursor must already be pointing 
    ** to a row with the same key as the new entry being inserted.  */
    assert( (flags & BTREE_SAVEPOSITION)==0 || 
            ((pCur->curFlags&BTCF_ValidNKey)!=0 && pX->nKey==pCur->info.nKey) );

    /* If the cursor is currently on the last row and we are appending a
    ** new row onto the end, set the "loc" to avoid an unnecessary
    ** btreeMoveto() call */
    if( (pCur->curFlags&BTCF_ValidNKey)!=0 && pX->nKey==pCur->info.nKey ){
      loc = 0;
    }else if( loc==0 ){
      rc = sqlite3BtreeMovetoUnpacked(pCur, 0, pX->nKey, flags!=0, &loc);
      if( rc ) return rc;
    }
  }else if( loc==0 && (flags & BTREE_SAVEPOSITION)==0 ){
    if( pX->nMem ){
      UnpackedRecord r;
      r.pKeyInfo = pCur->pKeyInfo;
      r.aMem = pX->aMem;
      r.nField = pX->nMem;
      r.default_rc = 0;
      r.errCode = 0;
      r.r1 = 0;
      r.r2 = 0;
      r.eqSeen = 0;
      rc = sqlite3BtreeMovetoUnpacked(pCur, &r, 0, flags!=0, &loc);
    }else{
      rc = btreeMoveto(pCur, pX->pKey, pX->nKey, flags!=0, &loc);
    }
    if( rc ) return rc;
  }
  assert( pCur->eState==CURSOR_VALID || (pCur->eState==CURSOR_INVALID && loc) );

  pPage = pCur->apPage[pCur->iPage];
  assert( pPage->intKey || pX->nKey>=0 );
  assert( pPage->leaf || !pPage->intKey );

  TRACE(("INSERT: table=%d nkey=%lld ndata=%d page=%d %s\n",
          pCur->pgnoRoot, pX->nKey, pX->nData, pPage->pgno,
          loc==0 ? "overwrite" : "new entry"));
  assert( pPage->isInit );
  newCell = pBt->pTmpSpace;
  assert( newCell!=0 );
  rc = fillInCell(pPage, newCell, pX, &szNew);
  if( rc ) goto end_insert;
  assert( szNew==pPage->xCellSize(pPage, newCell) );
  assert( szNew <= MX_CELL_SIZE(pBt) );
  idx = pCur->ix;
  if( loc==0 ){
    CellInfo info;
    assert( idx<pPage->nCell );
    rc = sqlite3PagerWrite(pPage->pDbPage);
    if( rc ){
      goto end_insert;
    }
    oldCell = findCell(pPage, idx);
    if( !pPage->leaf ){
      memcpy(newCell, oldCell, 4);
    }
    rc = clearCell(pPage, oldCell, &info);
    if( info.nSize==szNew && info.nLocal==info.nPayload 
     && (!ISAUTOVACUUM || szNew<pPage->minLocal)
    ){
      /* Overwrite the old cell with the new if they are the same size.
      ** We could also try to do this if the old cell is smaller, then add
      ** the leftover space to the free list.  But experiments show that
      ** doing that is no faster then skipping this optimization and just
      ** calling dropCell() and insertCell(). 
      **
      ** This optimization cannot be used on an autovacuum database if the
      ** new entry uses overflow pages, as the insertCell() call below is
      ** necessary to add the PTRMAP_OVERFLOW1 pointer-map entry.  */
      assert( rc==SQLITE_OK ); /* clearCell never fails when nLocal==nPayload */
      if( oldCell+szNew > pPage->aDataEnd ) return SQLITE_CORRUPT_BKPT;
      memcpy(oldCell, newCell, szNew);
      return SQLITE_OK;
    }
    dropCell(pPage, idx, info.nSize, &rc);
    if( rc ) goto end_insert;
  }else if( loc<0 && pPage->nCell>0 ){
    assert( pPage->leaf );
    idx = ++pCur->ix;
    pCur->curFlags &= ~BTCF_ValidNKey;
  }else{
    assert( pPage->leaf );
  }
  insertCell(pPage, idx, newCell, szNew, 0, 0, &rc);
  assert( pPage->nOverflow==0 || rc==SQLITE_OK );
  assert( rc!=SQLITE_OK || pPage->nCell>0 || pPage->nOverflow>0 );

  /* If no error has occurred and pPage has an overflow cell, call balance() 
  ** to redistribute the cells within the tree. Since balance() may move
  ** the cursor, zero the BtCursor.info.nSize and BTCF_ValidNKey
  ** variables.
  **
  ** Previous versions of SQLite called moveToRoot() to move the cursor
  ** back to the root page as balance() used to invalidate the contents
  ** of BtCursor.apPage[] and BtCursor.aiIdx[]. Instead of doing that,
  ** set the cursor state to "invalid". This makes common insert operations
  ** slightly faster.
  **
  ** There is a subtle but important optimization here too. When inserting
  ** multiple records into an intkey b-tree using a single cursor (as can
  ** happen while processing an "INSERT INTO ... SELECT" statement), it
  ** is advantageous to leave the cursor pointing to the last entry in
  ** the b-tree if possible. If the cursor is left pointing to the last
  ** entry in the table, and the next row inserted has an integer key
  ** larger than the largest existing key, it is possible to insert the
  ** row without seeking the cursor. This can be a big performance boost.
  */
  pCur->info.nSize = 0;
  if( pPage->nOverflow ){
    assert( rc==SQLITE_OK );
    pCur->curFlags &= ~(BTCF_ValidNKey);
    rc = balance(pCur);

    /* Must make sure nOverflow is reset to zero even if the balance()
    ** fails. Internal data structure corruption will result otherwise. 
    ** Also, set the cursor state to invalid. This stops saveCursorPosition()
    ** from trying to save the current position of the cursor.  */
    pCur->apPage[pCur->iPage]->nOverflow = 0;
    pCur->eState = CURSOR_INVALID;
    if( (flags & BTREE_SAVEPOSITION) && rc==SQLITE_OK ){
      rc = moveToRoot(pCur);
      if( pCur->pKeyInfo ){
        assert( pCur->pKey==0 );
        pCur->pKey = sqlite3Malloc( pX->nKey );
        if( pCur->pKey==0 ){
          rc = SQLITE_NOMEM;
        }else{
          memcpy(pCur->pKey, pX->pKey, pX->nKey);
        }
      }
      pCur->eState = CURSOR_REQUIRESEEK;
      pCur->nKey = pX->nKey;
    }
  }
  assert( pCur->apPage[pCur->iPage]->nOverflow==0 );

end_insert:
  return rc;
}